

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

PaUtilAllocationGroup * PaUtil_CreateAllocationGroup(void)

{
  PaUtilAllocationGroupLink *pPVar1;
  PaUtilAllocationGroupLink *links;
  PaUtilAllocationGroup *result;
  
  links = (PaUtilAllocationGroupLink *)0x0;
  pPVar1 = AllocateLinks(0x10,(PaUtilAllocationGroupLink *)0x0,(PaUtilAllocationGroupLink *)0x0);
  if (pPVar1 != (PaUtilAllocationGroupLink *)0x0) {
    links = (PaUtilAllocationGroupLink *)PaUtil_AllocateMemory(0x20);
    if (links == (PaUtilAllocationGroupLink *)0x0) {
      PaUtil_FreeMemory(pPVar1);
    }
    else {
      links->next = (PaUtilAllocationGroupLink *)0x10;
      links->buffer = pPVar1;
      links[1].next = pPVar1 + 1;
      links[1].buffer = (void *)0x0;
    }
  }
  return (PaUtilAllocationGroup *)links;
}

Assistant:

PaUtilAllocationGroup* PaUtil_CreateAllocationGroup( void )
{
    PaUtilAllocationGroup* result = 0;
    struct PaUtilAllocationGroupLink *links;


    links = AllocateLinks( PA_INITIAL_LINK_COUNT_, 0, 0 );
    if( links != 0 )
    {
        result = (PaUtilAllocationGroup*)PaUtil_AllocateMemory( sizeof(PaUtilAllocationGroup) );
        if( result )
        {
            result->linkCount = PA_INITIAL_LINK_COUNT_;
            result->linkBlocks = &links[0];
            result->spareLinks = &links[1];
            result->allocations = 0;
        }
        else
        {
            PaUtil_FreeMemory( links );
        }
    }

    return result;
}